

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionBody::RecordStatementAdjustment
          (FunctionBody *this,uint offset,StatementAdjustmentType adjType)

{
  StatementAdjustmentRecordList *pSVar1;
  Recycler *pRVar2;
  List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  AuxStatementData *this_01;
  StatementAdjustmentRecord local_60;
  StatementAdjustmentRecord record;
  TrackAllocData local_48;
  Recycler *local_20;
  Recycler *recycler;
  StatementAdjustmentType adjType_local;
  FunctionBody *pFStack_10;
  uint offset_local;
  FunctionBody *this_local;
  
  recycler._2_2_ = adjType;
  recycler._4_4_ = offset;
  pFStack_10 = this;
  EnsureAuxStatementData(this);
  local_20 = ScriptContext::GetRecycler
                       ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
  pSVar1 = GetStatementAdjustmentRecords(this);
  pRVar2 = local_20;
  if (pSVar1 == (StatementAdjustmentRecordList *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,
               (type_info *)
               &JsUtil::
                List<Js::FunctionBody::StatementAdjustmentRecord,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x135);
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_48);
    record = (StatementAdjustmentRecord)Memory::Recycler::AllocInlined;
    this_00 = (List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
               *)new<Memory::Recycler>(0x30,pRVar2,0x43c4b0);
    JsUtil::
    List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
    ::List(this_00,local_20,4);
    this_01 = Memory::WriteBarrierPtr<Js::FunctionBody::AuxStatementData>::operator->
                        (&(this->m_sourceInfo).m_auxStatementData);
    Memory::
    WriteBarrierPtr<JsUtil::List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>_>
    ::operator=(&this_01->m_statementAdjustmentRecords,this_00);
  }
  StatementAdjustmentRecord::StatementAdjustmentRecord(&local_60,recycler._2_2_,recycler._4_4_);
  pSVar1 = GetStatementAdjustmentRecords(this);
  JsUtil::
  List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add(pSVar1,&local_60);
  return;
}

Assistant:

void
    FunctionBody::RecordStatementAdjustment(uint offset, StatementAdjustmentType adjType)
    {
        this->EnsureAuxStatementData();

        Recycler* recycler = this->m_scriptContext->GetRecycler();
        if (this->GetStatementAdjustmentRecords() == nullptr)
        {
            m_sourceInfo.m_auxStatementData->m_statementAdjustmentRecords = RecyclerNew(recycler, StatementAdjustmentRecordList, recycler);
        }

        StatementAdjustmentRecord record(adjType, offset);
        this->GetStatementAdjustmentRecords()->Add(record); // Will copy stack value and put the copy into the container.
    }